

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  uint _h;
  int *piVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  int k_9;
  int iVar10;
  _func_int **pp_Var11;
  Layer *pLVar12;
  ulong uVar13;
  undefined4 *puVar14;
  void *pvVar15;
  byte bVar16;
  int k_15;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  void *pvVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined4 *puVar28;
  byte bVar29;
  int p_1;
  long lVar30;
  long lVar31;
  long lVar32;
  _func_int *p_Var33;
  long lVar34;
  int k_6;
  uint uVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  uint _w;
  int iVar39;
  _func_int **pp_Var40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  int k_12;
  int iVar47;
  _func_int **pp_Var48;
  long lVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  int iVar54;
  ulong uVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  int k;
  int iVar59;
  _func_int **pp_Var60;
  long lVar61;
  int iVar62;
  undefined4 *puVar63;
  Mat *pMVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  int iVar70;
  ulong uVar71;
  long lVar72;
  long lVar73;
  int i;
  int iVar74;
  ulong uVar75;
  long lVar76;
  undefined4 *puVar77;
  ulong uStackY_340;
  long local_328;
  long local_320;
  long local_310;
  long local_308;
  long local_2f0;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  ParamDict pd_6;
  ParamDict pd;
  undefined1 local_1c8 [8];
  int local_1c0;
  Allocator *local_1b8;
  int iStack_1b0;
  int iStack_1ac;
  size_t sStack_1a8;
  int local_1a0 [2];
  size_t local_198 [2];
  undefined4 uStack_188;
  undefined4 uStack_184;
  size_t local_180;
  undefined4 local_178;
  undefined8 local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  size_t sStack_160;
  undefined4 local_158;
  undefined8 local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  ParamDict pd_5;
  size_t local_f8;
  ModelBinFromMatArray local_80;
  int local_6c;
  long local_68;
  long local_60;
  void *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pp_Var11 = this->_vptr_Convolution_x86_avx512;
  p_Var33 = pp_Var11[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var33) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var33)) {
  case 1:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 2:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 3:
    pLVar12 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var33) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 4:
    pLVar12 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 5:
    pLVar12 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 6:
    pLVar12 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var33) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  default:
    pLVar12 = (Layer *)0x0;
    goto LAB_001b44ff;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar12->_vptr_Layer[4])(pLVar12,opt);
  pp_Var11 = this->_vptr_Convolution_x86_avx512;
LAB_001b44ff:
  this->activation = pLVar12;
  this->nT = opt->num_threads;
  p_Var33 = pp_Var11[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)p_Var33) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar17 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var33);
  iVar70 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var33);
  iVar18 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33);
  uVar13 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var33 + 4)) /
           (long)(iVar18 * iVar70);
  uVar13 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
           (long)(int)uVar17;
  uVar71 = uVar13 & 0xffffffff;
  if ((((iVar70 == iVar18 && opt->use_packing_layout == false) &&
       (iVar19 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33), iVar19 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33) == iVar19)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33) == 1)))) {
    pLVar12 = create_layer(6);
    this->convolution_dilation1 = pLVar12;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86_avx512[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var11 = this->_vptr_Convolution_x86_avx512;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var11[-3]) == 0) {
      local_198[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1c8 = SUB128(ZEXT812(0),4);
      local_1c0 = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      local_1a0[0] = 0;
      p_Var33 = pp_Var11[-3];
      iStack_1ac = pd.d._4_4_;
      sStack_1a8 = (size_t)local_1c8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33)) {
        piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
        uVar6 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        pd.d._0_4_ = (undefined4)uVar6;
        pd.d._4_4_ = (int)((ulong)uVar6 >> 0x20);
        local_1c8 = *(undefined1 (*) [8])((long)&(this->weight_winograd63_data).c + (long)p_Var33);
        local_1c0 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var33);
        local_1b8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var33);
        uVar6 = *(undefined8 *)((long)&this->gemm + (long)p_Var33);
        sStack_1a8 = *(size_t *)((long)&(this->scale_in_data).data + (long)p_Var33);
        iStack_1b0 = (int)uVar6;
        iStack_1ac = (int)((ulong)uVar6 >> 0x20);
        local_1a0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var33);
        local_198[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var33);
      }
      pLVar12 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_198[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1c8 = SUB128(ZEXT812(0),4);
      local_1c0 = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      local_1a0[0] = 0;
      p_Var33 = pp_Var11[-3];
      iStack_1ac = pd.d._4_4_;
      sStack_1a8 = (size_t)local_1c8;
      sStack_160 = (size_t)local_1c8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33)) {
        piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
        uVar6 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        pd.d._0_4_ = (undefined4)uVar6;
        pd.d._4_4_ = (int)((ulong)uVar6 >> 0x20);
        local_1c8 = *(undefined1 (*) [8])((long)&(this->weight_winograd63_data).c + (long)p_Var33);
        local_1c0 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var33);
        local_1b8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var33);
        uVar6 = *(undefined8 *)((long)&this->gemm + (long)p_Var33);
        sStack_1a8 = *(size_t *)((long)&(this->scale_in_data).data + (long)p_Var33);
        iStack_1b0 = (int)uVar6;
        iStack_1ac = (int)((ulong)uVar6 >> 0x20);
        local_1a0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var33);
        local_198[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var33);
        p_Var33 = this->_vptr_Convolution_x86_avx512[-3];
      }
      local_150 = 0;
      local_158 = 0;
      uStack_164 = 0;
      uStack_168 = 0;
      local_170 = 0;
      local_178 = 0;
      uStack_184 = 0;
      uStack_188 = 0;
      local_198[1] = 0;
      local_180 = sStack_160;
      if ((_func_int *)(local_198 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var33)) {
        piVar1 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var33);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_198[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var33);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var33);
        uStack_188 = (undefined4)uVar6;
        uStack_184 = (undefined4)((ulong)uVar6 >> 0x20);
        local_180 = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var33);
        local_178 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var33);
        local_170 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var33);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var33);
        sStack_160 = *(size_t *)(&this->field_0x1d8 + (long)p_Var33);
        uStack_168 = (undefined4)uVar6;
        uStack_164 = (undefined4)((ulong)uVar6 >> 0x20);
        local_158 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var33);
        local_150 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var33);
      }
      pLVar12 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar34 = 0x48;
      do {
        piVar1 = *(int **)((long)&pd.d + lVar34);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (*(long **)((long)&local_1b8 + lVar34) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar34));
            }
            else {
              (**(code **)(**(long **)((long)&local_1b8 + lVar34) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_198 + lVar34) = 0;
        *(undefined8 *)((long)&pd.d + lVar34 + 4) = 0;
        *(undefined8 *)(local_1c8 + lVar34 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar34) = 0;
        *(undefined8 *)((long)&pd.d + lVar34) = 0;
        *(undefined4 *)((long)local_1a0 + lVar34) = 0;
        *(undefined8 *)((long)&iStack_1b0 + lVar34) = 0;
        *(undefined8 *)((long)local_1a0 + lVar34 + -8) = 0;
        lVar34 = lVar34 + -0x48;
      } while (lVar34 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var33 = this->_vptr_Convolution_x86_avx512[-3];
      piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          plVar5 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var33);
          if (plVar5 == (long *)0x0) {
            free(*(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var33));
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).d + (long)p_Var33) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33) = 0;
      *(undefined8 *)((long)&this->gemm + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var33) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var33) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  _h = (uint)uVar13;
  if (opt->use_packing_layout == false) {
    uStackY_340 = 1;
    uVar38 = 1;
  }
  else {
    uStackY_340 = 0x10;
    uVar38 = 0x10;
    if ((uVar13 & 0xf) != 0) {
      if ((uVar13 & 7) == 0) {
        uVar38 = 8;
      }
      else {
        uVar38 = (ulong)((uint)((uVar13 & 3) == 0) * 3 + 1);
      }
    }
    if ((uVar17 & 0xf) != 0) {
      if ((uVar17 & 7) == 0) {
        uStackY_340 = 8;
      }
      else {
        uStackY_340 = (ulong)((uint)((uVar17 & 3) == 0) * 3 + 1);
      }
    }
  }
  bVar29 = opt->use_winograd23_convolution;
  if ((((bool)bVar29 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar7 = false;
  }
  else {
    bVar7 = 8 < (int)uVar17 || 8 < (int)_h;
  }
  if (((((iVar18 != 3) || (iVar70 != 3)) || (opt->use_winograd_convolution == false)) ||
      ((!bVar7 || (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33) != 1)))) ||
     ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33) != 1 ||
      ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33) != 1 ||
       (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33) != 1)))))) {
    iVar10 = get_cpu_level2_cache_size();
    p_Var33 = this->_vptr_Convolution_x86_avx512[-3];
    uVar17 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var33);
    iVar70 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var33);
    iVar18 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33);
    iVar19 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33);
    iVar20 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33);
    iVar21 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33);
    iVar22 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33);
    iVar23 = (int)uVar38;
    lVar34 = (long)(int)_h;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar10 < (int)(uVar17 * iVar70 * iVar18 * iVar19 * iVar20 * iVar21 * iVar22 * _h * 8) ||
         (0x10 < (int)_h || 0x10 < (int)uVar17))) || (iVar18 == 1 && iVar70 == 1)) {
      pLVar12 = create_layer(0x4a);
      this->gemm = pLVar12;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86_avx512[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar17 = iVar18 * iVar70;
      ParamDict::set(&pd_6,9,_h * uVar17);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86_avx512[-3]) == 0) |
                              1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      local_f8 = SUB168(ZEXT816(0) << 0x40,4);
      pMVar64 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86_avx512[-3]);
      Mat::reshape((Mat *)&pd,pMVar64,uVar17,_h,*(int *)&pMVar64[-2].data,(Allocator *)0x0);
      uVar71 = 0;
      Mat::create((Mat *)&pd_5,_h * uVar17,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86_avx512[-3]),4,(Allocator *)0x0);
      pp_Var11 = this->_vptr_Convolution_x86_avx512;
      uVar13 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar13 = uVar71;
      }
      for (; (long)uVar71 <
             (long)*(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var11[-3]);
          uVar71 = uVar71 + 1) {
        pp_Var40 = pd_5._vptr_ParamDict;
        for (lVar45 = 0; lVar45 < (long)(lVar34 - (ulong)(iVar23 - 1)); lVar45 = lVar45 + uVar38) {
          pp_Var48 = (_func_int **)
                     ((iStack_1ac * lVar45 + local_198[0] * uVar71) * (long)local_1c8 +
                     (long)pd._vptr_ParamDict);
          for (uVar55 = 0; pp_Var60 = pp_Var48, uVar75 = uVar38, uVar55 != uVar13;
              uVar55 = uVar55 + 1) {
            while (uVar75 != 0) {
              *(undefined4 *)pp_Var40 = *(undefined4 *)pp_Var60;
              pp_Var40 = (_func_int **)((long)pp_Var40 + 4);
              pp_Var60 = (_func_int **)((long)pp_Var60 + (long)local_1c8 * (long)iStack_1ac);
              uVar75 = uVar75 - 1;
            }
            pp_Var48 = (_func_int **)((long)pp_Var48 + 4);
          }
        }
      }
      piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86_avx512[-3]) == 0) {
        piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1c8 = (undefined1  [8])local_f8;
        local_1c0 = 0;
        local_1b8 = (Allocator *)0x0;
        iStack_1b0 = 0;
        iStack_1ac = 0;
        sStack_1a8 = local_f8;
        local_1a0[0] = 0;
        local_198[0] = 0;
        pLVar12 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_80,(Mat *)&pd);
        (*pLVar12->_vptr_Layer[3])(pLVar12,&local_80);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_80);
        piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_1c8 = SUB128(ZEXT812(0),4);
        piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_150 = 0;
        local_158 = 0;
        sStack_160 = (size_t)local_1c8;
        uStack_164 = 0;
        uStack_168 = 0;
        local_170 = 0;
        local_178 = 0;
        local_180 = (size_t)local_1c8;
        uStack_184 = 0;
        uStack_188 = 0;
        local_198[1] = 0;
        p_Var33 = this->_vptr_Convolution_x86_avx512[-3];
        if ((_func_int *)(local_198 + 1) !=
            (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var33)) {
          piVar1 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var33);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_198[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var33);
          uVar6 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var33);
          uStack_188 = (undefined4)uVar6;
          uStack_184 = (undefined4)((ulong)uVar6 >> 0x20);
          local_180 = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var33);
          local_178 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var33);
          local_170 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var33);
          uVar6 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var33);
          sStack_160 = *(size_t *)(&this->field_0x1d8 + (long)p_Var33);
          uStack_168 = (undefined4)uVar6;
          uStack_164 = (undefined4)((ulong)uVar6 >> 0x20);
          local_158 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var33);
          local_150 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var33);
        }
        local_198[0] = 0;
        local_1a0[0] = 0;
        iStack_1ac = 0;
        iStack_1b0 = 0;
        local_1b8 = (Allocator *)0x0;
        local_1c0 = 0;
        local_1c8 = (undefined1  [8])local_f8;
        pd.d._4_4_ = pd_5.d._4_4_;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pLVar12 = this->gemm;
        sStack_1a8 = (size_t)local_1c8;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_80,(Mat *)&pd);
        (*pLVar12->_vptr_Layer[3])(pLVar12,&local_80);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_80);
        lVar34 = 0x48;
        do {
          piVar1 = *(int **)((long)&pd.d + lVar34);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (*(long **)((long)&local_1b8 + lVar34) == (long *)0x0) {
                free(*(void **)((long)&pd._vptr_ParamDict + lVar34));
              }
              else {
                (**(code **)(**(long **)((long)&local_1b8 + lVar34) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)local_198 + lVar34) = 0;
          *(undefined8 *)((long)&pd.d + lVar34 + 4) = 0;
          *(undefined8 *)(local_1c8 + lVar34 + 4) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar34) = 0;
          *(undefined8 *)((long)&pd.d + lVar34) = 0;
          *(undefined4 *)((long)local_1a0 + lVar34) = 0;
          *(undefined8 *)((long)&iStack_1b0 + lVar34) = 0;
          *(undefined8 *)((long)local_1a0 + lVar34 + -8) = 0;
          lVar34 = lVar34 + -0x48;
        } while (lVar34 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          free(pd_5._vptr_ParamDict);
        }
      }
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      uVar13 = (ulong)(int)uVar17;
      iVar10 = (int)uStackY_340;
      if ((iVar10 == 1) && (iVar23 == 0x10)) {
LAB_001b4c9e:
        bVar7 = false;
        if ((iVar70 == 3) && (iVar18 == 3)) {
LAB_001b4cb1:
          bVar7 = false;
          if ((iVar19 == 1) && (iVar20 == 1)) {
LAB_001b4cc3:
            if ((iVar21 == 1) && (iVar22 == 1)) goto LAB_001b4cd5;
          }
        }
LAB_001b538b:
        if ((iVar10 == 4) &&
           ((((bVar7 && (iVar70 == 3)) && (iVar18 == 3)) && ((iVar19 == 1 && (iVar20 == 1)))))) {
          if (iVar21 == 2) {
            if (iVar22 == 2) goto LAB_001b4cd5;
          }
          else {
LAB_001b53af:
            if ((iVar21 == 1) && (iVar22 == 1)) {
LAB_001b4cd5:
              uVar35 = iVar18 * iVar70;
              Mat::reshape((Mat *)&pd,
                           (Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
                           uVar35,_h,uVar17,(Allocator *)0x0);
              Mat::create(&this->weight_data_tm,uVar35,
                          (int)((long)((ulong)(uint)((int)_h >> 0x1f) << 0x20 | uVar71) /
                               (long)iVar23),(int)uVar17 / iVar10,(ulong)(uint)(iVar23 * iVar10 * 4)
                          ,iVar23 * iVar10,(Allocator *)0x0);
              pvVar2 = (this->weight_data_tm).data;
              sVar3 = (this->weight_data_tm).elemsize;
              sVar4 = (this->weight_data_tm).cstep;
              for (uVar71 = 0; (long)uVar71 < (long)(uVar13 - (iVar10 - 1));
                  uVar71 = uVar71 + uStackY_340) {
                puVar14 = (undefined4 *)
                          ((long)(int)((long)((ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                             uVar71 & 0xffffffff) / (long)iVar10) * sVar3 * sVar4 +
                          (long)pvVar2);
                for (lVar45 = 0; lVar45 < (long)(lVar34 - (ulong)(iVar23 - 1));
                    lVar45 = lVar45 + uVar38) {
                  lVar56 = 0;
                  for (uVar55 = 0; uVar55 != uVar35; uVar55 = uVar55 + 1) {
                    lVar72 = lVar45;
                    for (uVar75 = 0; uVar75 != uVar38; uVar75 = uVar75 + 1) {
                      puVar63 = (undefined4 *)
                                ((long)pd._vptr_ParamDict +
                                (iStack_1ac * lVar72 + uVar71 * local_198[0]) * (long)local_1c8 +
                                lVar56);
                      uVar41 = uStackY_340;
                      while (bVar7 = uVar41 != 0, uVar41 = uVar41 - 1, bVar7) {
                        *puVar14 = *puVar63;
                        puVar14 = puVar14 + 1;
                        puVar63 = (undefined4 *)((long)puVar63 + (long)local_1c8 * local_198[0]);
                      }
                      lVar72 = lVar72 + 1;
                    }
                    lVar56 = lVar56 + 4;
                  }
                }
              }
              piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  if (local_1b8 == (Allocator *)0x0) {
                    free(pd._vptr_ParamDict);
                  }
                  else {
                    (*local_1b8->_vptr_Allocator[3])();
                  }
                }
              }
              goto LAB_001b5269;
            }
          }
        }
      }
      else {
        if ((iVar10 == 8) && (iVar23 == 8)) {
          bVar7 = false;
          if (iVar70 != 2) goto LAB_001b4c9e;
          if (iVar18 != 2) goto LAB_001b538b;
          goto LAB_001b4cb1;
        }
        bVar7 = iVar23 == 1;
        if ((((iVar10 == 8) && (iVar23 == 1)) && (iVar70 == 3)) &&
           (((iVar18 == 3 && (iVar19 == 1)) && (iVar20 == 1)))) {
          bVar7 = true;
          if (iVar21 != 2) goto LAB_001b4cc3;
          if (iVar22 != 2) goto LAB_001b538b;
          goto LAB_001b4cd5;
        }
        if ((iVar10 != 1) || (iVar23 != 8)) goto LAB_001b538b;
        if ((iVar70 == 3) && (((iVar18 == 3 && (iVar19 == 1)) && (iVar20 == 1)))) goto LAB_001b53af;
      }
      uVar36 = iVar18 * iVar70;
      uVar35 = _h;
      if ((int)uVar17 < 0x10) {
        if ((int)uVar17 < 8) {
          if ((int)uVar17 < 4) {
            if ((int)uVar17 < 2) {
              if ((int)_h < 0x10) {
                if ((int)_h < 8) {
                  if ((int)_h < 4) {
                    _w = uVar36;
                    if (1 < (int)_h) {
                      _w = uVar36 * 2;
                      uVar35 = (_h & 1) + 1;
                    }
                  }
                  else {
                    _w = uVar36 * 4;
                    uVar35 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
                  }
                }
                else {
                  _w = uVar36 * 8;
                  uVar35 = (_h & 1) + 1 + ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
                }
              }
              else {
                _w = uVar36 * 0x10;
                uVar35 = (_h & 1) + (int)(uVar71 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                         ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
              }
            }
            else if ((int)_h < 0x10) {
              if ((int)_h < 8) {
                if (3 < (int)_h) {
                  uVar35 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
                  _w = uVar36 * 8;
                  goto LAB_001b56d8;
                }
                if ((int)_h < 2) {
                  uVar17 = (uVar17 & 1) + 1;
                  _w = uVar36 * 2;
                  goto LAB_001b5ad8;
                }
                _w = uVar36 * 4;
                uVar35 = (_h & 1) + 1;
              }
              else {
                _w = uVar36 * 0x10;
                uVar35 = (_h & 1) + 1 + ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
              }
              uVar17 = (uVar17 & 1) + 1;
            }
            else {
              _w = uVar36 * 0x20;
              uVar35 = (_h & 1) + (int)(uVar71 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                       ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
LAB_001b56d8:
              uVar17 = (uVar17 & 1) + 1;
            }
          }
          else {
            if ((int)_h < 0x10) {
              if ((int)_h < 8) {
                if ((int)_h < 4) {
                  if ((int)_h < 2) {
                    uVar17 = (uVar17 & 1) + 1 + (uint)((uVar17 >> 1 & 1) != 0);
                    _w = uVar36 * 4;
                    goto LAB_001b5ad8;
                  }
                  _w = uVar36 * 8;
                  uVar35 = (_h & 1) + 1;
                }
                else {
                  _w = uVar36 * 0x10;
                  uVar35 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
                }
              }
              else {
                _w = uVar36 * 0x20;
                uVar35 = (_h & 1) + 1 + ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
              }
            }
            else {
              _w = uVar36 * 0x40;
              uVar35 = (_h & 1) + (int)(uVar71 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                       ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
            }
            uVar17 = (uVar17 & 1) + 1 + (uint)((uVar17 >> 1 & 1) != 0);
          }
        }
        else if ((int)_h < 0x10) {
          if ((int)_h < 8) {
            if (3 < (int)_h) {
              _w = uVar36 * 0x20;
              uVar35 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
              goto LAB_001b5478;
            }
            if ((int)_h < 2) {
              uVar17 = (uVar17 & 1) + 1 + (uVar17 >> 2 & 1) + (uint)((uVar17 >> 1 & 1) != 0);
              _w = uVar36 * 8;
              goto LAB_001b5ad8;
            }
            _w = uVar36 * 0x10;
            uVar35 = (_h & 1) + 1;
          }
          else {
            _w = uVar36 * 0x40;
            uVar35 = (_h & 1) + 1 + ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
          }
          uVar17 = (uVar17 & 1) + 1 + ((uint)(uVar13 >> 2) & 1) + (uint)((uVar17 >> 1 & 1) != 0);
        }
        else {
          _w = uVar36 * 0x80;
          uVar35 = (_h & 1) + (int)(uVar71 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                   ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
LAB_001b5478:
          uVar17 = (uVar17 & 1) + 1 + (uVar17 >> 2 & 1) + (uint)((uVar17 >> 1 & 1) != 0);
        }
      }
      else if ((int)_h < 0x10) {
        if ((int)_h < 8) {
          if (3 < (int)_h) {
            _w = uVar36 * 0x40;
            uVar35 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
            goto LAB_001b5410;
          }
          if ((int)_h < 2) {
            uVar17 = (uVar17 & 1) + ((uint)(uVar13 >> 4) & 0xfffffff) +
                     (uint)((uVar17 >> 3 & 1) != 0) + ((uint)(uVar13 >> 2) & 1) +
                     (uint)((uVar17 >> 1 & 1) != 0);
            _w = uVar36 * 0x10;
            goto LAB_001b5ad8;
          }
          _w = uVar36 * 0x20;
          uVar35 = (_h & 1) + 1;
        }
        else {
          _w = uVar36 * 0x80;
          uVar35 = (_h & 1) + 1 + ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
        }
        uVar17 = (uVar17 & 1) + (uVar17 >> 4) + (uint)((uVar17 >> 3 & 1) != 0) + (uVar17 >> 2 & 1) +
                 (uint)((uVar17 >> 1 & 1) != 0);
      }
      else {
        _w = uVar36 * 0x100;
        uVar35 = (_h & 1) + (int)(uVar71 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                 ((uint)(uVar71 >> 2) & 1) + (uint)((_h >> 1 & 1) != 0);
LAB_001b5410:
        uVar17 = (uVar17 & 1) + ((uint)(uVar13 >> 4) & 0xfffffff) + (uint)((uVar17 >> 3 & 1) != 0) +
                 ((uint)(uVar13 >> 2) & 1) + (uint)((uVar17 >> 1 & 1) != 0);
      }
LAB_001b5ad8:
      Mat::create(&this->weight_data_tm,_w,uVar35,uVar17,4,(Allocator *)0x0);
      local_50 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
      local_58 = (this->weight_data_tm).data;
      local_60 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
      local_68 = (long)(int)uVar36;
      iVar70 = 0;
      uVar71 = 0;
      if (0 < (int)uVar36) {
        uVar71 = (ulong)uVar36;
      }
      iVar51 = uVar36 * _h;
      local_6c = iVar51 * 0x10;
      iVar54 = iVar51 * 2;
      iVar59 = iVar51 * 3;
      iVar74 = iVar51 * 4;
      iVar18 = iVar51 * 5;
      local_110 = local_68 * 0x40;
      local_118 = local_68 * 0x20;
      local_120 = local_68 * 0x10;
      iVar19 = iVar51 * 6;
      iVar20 = iVar51 * 7;
      iVar39 = iVar51 * 0xf;
      lVar45 = local_68 * 4;
      iVar47 = iVar51 * 0xe;
      iVar62 = iVar51 * 0xd;
      iVar44 = iVar51 * 0xc;
      iVar21 = iVar51 * 0xb;
      iVar22 = iVar51 * 10;
      iVar10 = iVar51 * 9;
      iVar23 = iVar51 * 8;
      local_128 = local_68 * 8;
      local_148 = uVar71 * 4;
      for (uVar38 = 0; (long)(uVar38 | 0xf) < (long)uVar13; uVar38 = uVar38 + 0x10) {
        lVar56 = local_50 + (long)iVar39 * 4;
        local_38 = local_50 + (long)iVar47 * 4;
        local_40 = local_50 + (long)iVar62 * 4;
        local_48 = local_50 + (long)iVar44 * 4;
        lVar72 = local_50 + (long)iVar21 * 4;
        lVar32 = local_50 + (long)iVar22 * 4;
        lVar37 = local_50 + (long)iVar10 * 4;
        lVar50 = local_50 + (long)iVar23 * 4;
        lVar52 = local_50 + (long)iVar20 * 4;
        lVar57 = local_50 + (long)iVar19 * 4;
        lVar67 = local_50 + (long)iVar18 * 4;
        lVar68 = local_50 + (long)iVar74 * 4;
        lVar73 = local_50 + (long)iVar59 * 4;
        lVar76 = local_50 + (long)iVar54 * 4;
        lVar30 = local_50 + (long)iVar51 * 4;
        lVar42 = local_50 + (long)iVar70 * 4;
        puVar14 = (undefined4 *)((uVar38 >> 4) * local_60 + (long)local_58);
        local_130 = 0;
        local_2c8 = lVar56;
        local_2c0 = lVar76;
        local_2b0 = lVar57;
        local_2a8 = lVar67;
        local_2a0 = lVar68;
        local_298 = lVar73;
        local_290 = lVar30;
        local_288 = lVar42;
        local_280 = local_38;
        local_278 = local_40;
        local_270 = local_48;
        local_268 = lVar72;
        local_260 = lVar32;
        local_258 = lVar37;
        local_250 = lVar50;
        local_248 = lVar52;
        for (uVar55 = 0; (long)(uVar55 | 0xf) < lVar34; uVar55 = uVar55 + 0x10) {
          lVar66 = local_130;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar65 = lVar66;
            for (lVar49 = 0; (int)lVar49 != 0x400; lVar49 = lVar49 + 0x40) {
              *(undefined4 *)((long)puVar14 + lVar49) = *(undefined4 *)(lVar42 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 4) = *(undefined4 *)(lVar30 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 8) = *(undefined4 *)(lVar76 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0xc) = *(undefined4 *)(lVar73 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x10) = *(undefined4 *)(lVar68 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x14) = *(undefined4 *)(lVar67 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x18) = *(undefined4 *)(lVar57 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x1c) = *(undefined4 *)(lVar52 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x20) = *(undefined4 *)(lVar50 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x24) = *(undefined4 *)(lVar37 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x28) = *(undefined4 *)(lVar32 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x2c) = *(undefined4 *)(lVar72 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x30) = *(undefined4 *)(local_48 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x34) = *(undefined4 *)(local_40 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x38) = *(undefined4 *)(local_38 + lVar65);
              *(undefined4 *)((long)puVar14 + lVar49 + 0x3c) = *(undefined4 *)(lVar56 + lVar65);
              lVar65 = lVar65 + lVar45;
            }
            lVar66 = lVar66 + 4;
            puVar14 = (undefined4 *)((long)puVar14 + lVar49);
          }
          local_130 = local_130 + local_110;
          local_2c8 = local_2c8 + local_110;
          local_280 = local_280 + local_110;
          local_278 = local_278 + local_110;
          local_270 = local_270 + local_110;
          local_268 = local_268 + local_110;
          local_260 = local_260 + local_110;
          local_258 = local_258 + local_110;
          local_250 = local_250 + local_110;
          local_248 = local_248 + local_110;
          local_2b0 = local_2b0 + local_110;
          local_2a8 = local_2a8 + local_110;
          local_2a0 = local_2a0 + local_110;
          local_298 = local_298 + local_110;
          local_2c0 = local_2c0 + local_110;
          local_290 = local_290 + local_110;
          local_288 = local_288 + local_110;
        }
        for (; (long)(uVar55 | 7) < lVar34; uVar55 = uVar55 + 8) {
          local_310 = local_2c0;
          local_308 = local_298;
          local_2f0 = local_2a0;
          lVar56 = local_280;
          lVar72 = local_2c8;
          lVar32 = local_248;
          lVar37 = local_270;
          lVar50 = local_278;
          lVar52 = local_2a8;
          lVar57 = local_2b0;
          lVar67 = local_260;
          lVar68 = local_268;
          lVar73 = local_250;
          lVar76 = local_258;
          local_328 = local_290;
          local_320 = local_288;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar42 = 0;
            for (lVar30 = 0; (int)lVar30 != 0x200; lVar30 = lVar30 + 0x40) {
              *(undefined4 *)((long)puVar14 + lVar30) = *(undefined4 *)(local_320 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 4) = *(undefined4 *)(local_328 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 8) = *(undefined4 *)(local_310 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0xc) = *(undefined4 *)(local_308 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x10) = *(undefined4 *)(local_2f0 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x14) = *(undefined4 *)(lVar52 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x18) = *(undefined4 *)(lVar57 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x1c) = *(undefined4 *)(lVar32 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x20) = *(undefined4 *)(lVar73 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x24) = *(undefined4 *)(lVar76 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x28) = *(undefined4 *)(lVar67 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x2c) = *(undefined4 *)(lVar68 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x30) = *(undefined4 *)(lVar37 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x34) = *(undefined4 *)(lVar50 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x38) = *(undefined4 *)(lVar56 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x3c) = *(undefined4 *)(lVar72 + lVar42);
              lVar42 = lVar42 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar30);
            lVar72 = lVar72 + 4;
            lVar56 = lVar56 + 4;
            lVar50 = lVar50 + 4;
            lVar37 = lVar37 + 4;
            lVar68 = lVar68 + 4;
            lVar67 = lVar67 + 4;
            lVar76 = lVar76 + 4;
            lVar73 = lVar73 + 4;
            lVar32 = lVar32 + 4;
            lVar57 = lVar57 + 4;
            lVar52 = lVar52 + 4;
            local_2f0 = local_2f0 + 4;
            local_308 = local_308 + 4;
            local_310 = local_310 + 4;
            local_328 = local_328 + 4;
            local_320 = local_320 + 4;
          }
          local_2c8 = local_2c8 + local_118;
          local_280 = local_280 + local_118;
          local_278 = local_278 + local_118;
          local_270 = local_270 + local_118;
          local_268 = local_268 + local_118;
          local_260 = local_260 + local_118;
          local_258 = local_258 + local_118;
          local_250 = local_250 + local_118;
          local_248 = local_248 + local_118;
          local_2b0 = local_2b0 + local_118;
          local_2a8 = local_2a8 + local_118;
          local_2a0 = local_2a0 + local_118;
          local_298 = local_298 + local_118;
          local_2c0 = local_2c0 + local_118;
          local_290 = local_290 + local_118;
          local_288 = local_288 + local_118;
        }
        for (; (long)(uVar55 | 3) < lVar34; uVar55 = uVar55 + 4) {
          local_310 = local_2c0;
          local_308 = local_298;
          local_2f0 = local_2a0;
          lVar56 = local_270;
          lVar72 = local_268;
          lVar32 = local_248;
          lVar37 = local_280;
          lVar50 = local_278;
          lVar52 = local_2a8;
          lVar57 = local_2b0;
          lVar67 = local_260;
          lVar68 = local_2c8;
          lVar73 = local_250;
          lVar76 = local_258;
          local_328 = local_290;
          local_320 = local_288;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar42 = 0;
            for (lVar30 = 0; (int)lVar30 != 0x100; lVar30 = lVar30 + 0x40) {
              *(undefined4 *)((long)puVar14 + lVar30) = *(undefined4 *)(local_320 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 4) = *(undefined4 *)(local_328 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 8) = *(undefined4 *)(local_310 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0xc) = *(undefined4 *)(local_308 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x10) = *(undefined4 *)(local_2f0 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x14) = *(undefined4 *)(lVar52 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x18) = *(undefined4 *)(lVar57 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x1c) = *(undefined4 *)(lVar32 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x20) = *(undefined4 *)(lVar73 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x24) = *(undefined4 *)(lVar76 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x28) = *(undefined4 *)(lVar67 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x2c) = *(undefined4 *)(lVar72 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x30) = *(undefined4 *)(lVar56 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x34) = *(undefined4 *)(lVar50 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x38) = *(undefined4 *)(lVar37 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x3c) = *(undefined4 *)(lVar68 + lVar42);
              lVar42 = lVar42 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar30);
            lVar72 = lVar72 + 4;
            lVar56 = lVar56 + 4;
            lVar50 = lVar50 + 4;
            lVar37 = lVar37 + 4;
            lVar68 = lVar68 + 4;
            lVar67 = lVar67 + 4;
            lVar76 = lVar76 + 4;
            lVar73 = lVar73 + 4;
            lVar32 = lVar32 + 4;
            lVar57 = lVar57 + 4;
            lVar52 = lVar52 + 4;
            local_2f0 = local_2f0 + 4;
            local_308 = local_308 + 4;
            local_310 = local_310 + 4;
            local_328 = local_328 + 4;
            local_320 = local_320 + 4;
          }
          local_268 = local_268 + local_120;
          local_270 = local_270 + local_120;
          local_278 = local_278 + local_120;
          local_280 = local_280 + local_120;
          local_2c8 = local_2c8 + local_120;
          local_260 = local_260 + local_120;
          local_258 = local_258 + local_120;
          local_250 = local_250 + local_120;
          local_248 = local_248 + local_120;
          local_2b0 = local_2b0 + local_120;
          local_2a8 = local_2a8 + local_120;
          local_2a0 = local_2a0 + local_120;
          local_298 = local_298 + local_120;
          local_2c0 = local_2c0 + local_120;
          local_290 = local_290 + local_120;
          local_288 = local_288 + local_120;
        }
        for (; (long)(uVar55 | 1) < lVar34; uVar55 = uVar55 + 2) {
          local_320 = local_2c8;
          local_328 = local_280;
          local_310 = local_278;
          local_308 = local_270;
          local_2f0 = local_268;
          lVar56 = local_290;
          lVar72 = local_288;
          lVar32 = local_250;
          lVar37 = local_298;
          lVar50 = local_2c0;
          lVar52 = local_260;
          lVar57 = local_258;
          lVar67 = local_2a8;
          lVar68 = local_2a0;
          lVar73 = local_248;
          lVar76 = local_2b0;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar42 = 0;
            for (lVar30 = 0; (int)lVar30 != 0x80; lVar30 = lVar30 + 0x40) {
              *(undefined4 *)((long)puVar14 + lVar30) = *(undefined4 *)(lVar72 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 4) = *(undefined4 *)(lVar56 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 8) = *(undefined4 *)(lVar50 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0xc) = *(undefined4 *)(lVar37 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x10) = *(undefined4 *)(lVar68 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x14) = *(undefined4 *)(lVar67 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x18) = *(undefined4 *)(lVar76 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x1c) = *(undefined4 *)(lVar73 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x20) = *(undefined4 *)(lVar32 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x24) = *(undefined4 *)(lVar57 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x28) = *(undefined4 *)(lVar52 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x2c) = *(undefined4 *)(local_2f0 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x30) = *(undefined4 *)(local_308 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x34) = *(undefined4 *)(local_310 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x38) = *(undefined4 *)(local_328 + lVar42);
              *(undefined4 *)((long)puVar14 + lVar30 + 0x3c) = *(undefined4 *)(local_320 + lVar42);
              lVar42 = lVar42 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar30);
            lVar72 = lVar72 + 4;
            lVar56 = lVar56 + 4;
            lVar50 = lVar50 + 4;
            lVar37 = lVar37 + 4;
            lVar68 = lVar68 + 4;
            lVar67 = lVar67 + 4;
            lVar76 = lVar76 + 4;
            lVar73 = lVar73 + 4;
            lVar32 = lVar32 + 4;
            lVar57 = lVar57 + 4;
            lVar52 = lVar52 + 4;
            local_2f0 = local_2f0 + 4;
            local_308 = local_308 + 4;
            local_310 = local_310 + 4;
            local_328 = local_328 + 4;
            local_320 = local_320 + 4;
          }
          local_288 = local_288 + local_128;
          local_290 = local_290 + local_128;
          local_2c0 = local_2c0 + local_128;
          local_298 = local_298 + local_128;
          local_2a0 = local_2a0 + local_128;
          local_2a8 = local_2a8 + local_128;
          local_2b0 = local_2b0 + local_128;
          local_248 = local_248 + local_128;
          local_250 = local_250 + local_128;
          local_258 = local_258 + local_128;
          local_260 = local_260 + local_128;
          local_268 = local_268 + local_128;
          local_270 = local_270 + local_128;
          local_278 = local_278 + local_128;
          local_280 = local_280 + local_128;
          local_2c8 = local_2c8 + local_128;
        }
        for (; (long)uVar55 < lVar34; uVar55 = uVar55 + 1) {
          for (lVar56 = 0; local_148 != lVar56; lVar56 = lVar56 + 4) {
            *puVar14 = *(undefined4 *)(local_288 + lVar56);
            puVar14[1] = *(undefined4 *)(local_290 + lVar56);
            puVar14[2] = *(undefined4 *)(local_2c0 + lVar56);
            puVar14[3] = *(undefined4 *)(local_298 + lVar56);
            puVar14[4] = *(undefined4 *)(local_2a0 + lVar56);
            puVar14[5] = *(undefined4 *)(local_2a8 + lVar56);
            puVar14[6] = *(undefined4 *)(local_2b0 + lVar56);
            puVar14[7] = *(undefined4 *)(local_248 + lVar56);
            puVar14[8] = *(undefined4 *)(local_250 + lVar56);
            puVar14[9] = *(undefined4 *)(local_258 + lVar56);
            puVar14[10] = *(undefined4 *)(local_260 + lVar56);
            puVar14[0xb] = *(undefined4 *)(local_268 + lVar56);
            puVar14[0xc] = *(undefined4 *)(local_270 + lVar56);
            puVar14[0xd] = *(undefined4 *)(local_278 + lVar56);
            puVar14[0xe] = *(undefined4 *)(local_280 + lVar56);
            puVar14[0xf] = *(undefined4 *)(local_2c8 + lVar56);
            puVar14 = puVar14 + 0x10;
          }
          local_2c8 = local_2c8 + lVar45;
          local_280 = local_280 + lVar45;
          local_278 = local_278 + lVar45;
          local_270 = local_270 + lVar45;
          local_268 = local_268 + lVar45;
          local_260 = local_260 + lVar45;
          local_258 = local_258 + lVar45;
          local_250 = local_250 + lVar45;
          local_248 = local_248 + lVar45;
          local_2b0 = local_2b0 + lVar45;
          local_2a8 = local_2a8 + lVar45;
          local_2a0 = local_2a0 + lVar45;
          local_298 = local_298 + lVar45;
          local_2c0 = local_2c0 + lVar45;
          local_290 = local_290 + lVar45;
          local_288 = local_288 + lVar45;
        }
        iVar70 = iVar70 + local_6c;
        iVar51 = iVar51 + local_6c;
        iVar54 = iVar54 + local_6c;
        iVar59 = iVar59 + local_6c;
        iVar74 = iVar74 + local_6c;
        iVar18 = iVar18 + local_6c;
        iVar19 = iVar19 + local_6c;
        iVar20 = iVar20 + local_6c;
        iVar39 = iVar39 + local_6c;
        iVar47 = iVar47 + local_6c;
        iVar62 = iVar62 + local_6c;
        iVar44 = iVar44 + local_6c;
        iVar21 = iVar21 + local_6c;
        iVar22 = iVar22 + local_6c;
        iVar10 = iVar10 + local_6c;
        iVar23 = iVar23 + local_6c;
      }
      lVar56 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
      pvVar2 = (this->weight_data_tm).data;
      sVar3 = (this->weight_data_tm).elemsize;
      sVar4 = (this->weight_data_tm).cstep;
      iVar21 = _h * uVar36;
      iVar22 = iVar21 * 8;
      for (; (long)(uVar38 | 7) < (long)uVar13; uVar38 = uVar38 + 8) {
        lVar72 = lVar56 + (long)iVar70 * 4;
        lVar32 = lVar56 + (long)iVar51 * 4;
        lVar37 = lVar56 + (long)iVar54 * 4;
        lVar50 = lVar56 + (long)iVar59 * 4;
        lVar52 = lVar56 + (long)iVar74 * 4;
        lVar57 = lVar56 + (long)iVar18 * 4;
        lVar67 = lVar56 + (long)iVar19 * 4;
        lVar68 = lVar56 + (long)iVar20 * 4;
        pvVar15 = (void *)((ulong)(((uint)(uVar38 >> 4) & 0xfffffff) +
                                  (uint)(((uint)uVar38 >> 3 & 1) != 0)) * sVar3 * sVar4 +
                          (long)pvVar2);
        local_2c0 = 0;
        lVar73 = lVar72;
        local_308 = lVar67;
        lVar76 = lVar32;
        local_2f0 = lVar57;
        local_328 = lVar50;
        local_320 = lVar52;
        local_310 = lVar37;
        local_2d0 = lVar68;
        for (uVar55 = 0; (long)(uVar55 | 0xf) < lVar34; uVar55 = uVar55 + 0x10) {
          lVar30 = local_2c0;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar42 = lVar30;
            for (lVar66 = 0; (int)lVar66 != 0x200; lVar66 = lVar66 + 0x20) {
              *(undefined4 *)((long)pvVar15 + lVar66) = *(undefined4 *)(lVar72 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar66 + 4) = *(undefined4 *)(lVar32 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar66 + 8) = *(undefined4 *)(lVar37 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar66 + 0xc) = *(undefined4 *)(lVar50 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar66 + 0x10) = *(undefined4 *)(lVar52 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar66 + 0x14) = *(undefined4 *)(lVar57 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar66 + 0x18) = *(undefined4 *)(lVar67 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar66 + 0x1c) = *(undefined4 *)(lVar68 + lVar42);
              lVar42 = lVar42 + lVar45;
            }
            pvVar15 = (void *)((long)pvVar15 + lVar66);
            lVar30 = lVar30 + 4;
          }
          local_2c0 = local_2c0 + local_110;
          lVar73 = lVar73 + local_110;
          lVar76 = lVar76 + local_110;
          local_310 = local_310 + local_110;
          local_328 = local_328 + local_110;
          local_320 = local_320 + local_110;
          local_2f0 = local_2f0 + local_110;
          local_308 = local_308 + local_110;
          local_2d0 = local_2d0 + local_110;
        }
        for (; (long)(uVar55 | 7) < lVar34; uVar55 = uVar55 + 8) {
          lVar72 = local_2d0;
          lVar32 = local_310;
          lVar37 = lVar73;
          lVar50 = local_308;
          lVar52 = local_2f0;
          lVar57 = local_320;
          lVar67 = local_328;
          lVar68 = lVar76;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar42 = 0;
            for (lVar30 = 0; (int)lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
              *(undefined4 *)((long)pvVar15 + lVar30) = *(undefined4 *)(lVar37 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 4) = *(undefined4 *)(lVar68 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 8) = *(undefined4 *)(lVar32 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0xc) = *(undefined4 *)(lVar67 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x10) = *(undefined4 *)(lVar57 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x14) = *(undefined4 *)(lVar52 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x18) = *(undefined4 *)(lVar50 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x1c) = *(undefined4 *)(lVar72 + lVar42);
              lVar42 = lVar42 + lVar45;
            }
            pvVar15 = (void *)((long)pvVar15 + lVar30);
            lVar37 = lVar37 + 4;
            lVar68 = lVar68 + 4;
            lVar32 = lVar32 + 4;
            lVar67 = lVar67 + 4;
            lVar57 = lVar57 + 4;
            lVar52 = lVar52 + 4;
            lVar50 = lVar50 + 4;
            lVar72 = lVar72 + 4;
          }
          lVar73 = lVar73 + local_118;
          lVar76 = lVar76 + local_118;
          local_310 = local_310 + local_118;
          local_328 = local_328 + local_118;
          local_320 = local_320 + local_118;
          local_2f0 = local_2f0 + local_118;
          local_308 = local_308 + local_118;
          local_2d0 = local_2d0 + local_118;
        }
        for (; (long)(uVar55 | 3) < lVar34; uVar55 = uVar55 + 4) {
          lVar72 = local_2d0;
          lVar32 = local_310;
          lVar37 = lVar73;
          lVar50 = local_308;
          lVar52 = local_2f0;
          lVar57 = local_320;
          lVar67 = local_328;
          lVar68 = lVar76;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar42 = 0;
            for (lVar30 = 0; (int)lVar30 != 0x80; lVar30 = lVar30 + 0x20) {
              *(undefined4 *)((long)pvVar15 + lVar30) = *(undefined4 *)(lVar37 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 4) = *(undefined4 *)(lVar68 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 8) = *(undefined4 *)(lVar32 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0xc) = *(undefined4 *)(lVar67 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x10) = *(undefined4 *)(lVar57 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x14) = *(undefined4 *)(lVar52 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x18) = *(undefined4 *)(lVar50 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x1c) = *(undefined4 *)(lVar72 + lVar42);
              lVar42 = lVar42 + lVar45;
            }
            pvVar15 = (void *)((long)pvVar15 + lVar30);
            lVar37 = lVar37 + 4;
            lVar68 = lVar68 + 4;
            lVar32 = lVar32 + 4;
            lVar67 = lVar67 + 4;
            lVar57 = lVar57 + 4;
            lVar52 = lVar52 + 4;
            lVar50 = lVar50 + 4;
            lVar72 = lVar72 + 4;
          }
          lVar73 = lVar73 + local_120;
          lVar76 = lVar76 + local_120;
          local_310 = local_310 + local_120;
          local_328 = local_328 + local_120;
          local_320 = local_320 + local_120;
          local_2f0 = local_2f0 + local_120;
          local_308 = local_308 + local_120;
          local_2d0 = local_2d0 + local_120;
        }
        for (; (long)(uVar55 | 1) < lVar34; uVar55 = uVar55 + 2) {
          lVar72 = local_2d0;
          lVar32 = local_310;
          lVar37 = lVar73;
          lVar50 = local_308;
          lVar52 = local_2f0;
          lVar57 = local_320;
          lVar67 = local_328;
          lVar68 = lVar76;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar42 = 0;
            for (lVar30 = 0; (int)lVar30 != 0x40; lVar30 = lVar30 + 0x20) {
              *(undefined4 *)((long)pvVar15 + lVar30) = *(undefined4 *)(lVar37 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 4) = *(undefined4 *)(lVar68 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 8) = *(undefined4 *)(lVar32 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0xc) = *(undefined4 *)(lVar67 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x10) = *(undefined4 *)(lVar57 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x14) = *(undefined4 *)(lVar52 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x18) = *(undefined4 *)(lVar50 + lVar42);
              *(undefined4 *)((long)pvVar15 + lVar30 + 0x1c) = *(undefined4 *)(lVar72 + lVar42);
              lVar42 = lVar42 + lVar45;
            }
            pvVar15 = (void *)((long)pvVar15 + lVar30);
            lVar37 = lVar37 + 4;
            lVar68 = lVar68 + 4;
            lVar32 = lVar32 + 4;
            lVar67 = lVar67 + 4;
            lVar57 = lVar57 + 4;
            lVar52 = lVar52 + 4;
            lVar50 = lVar50 + 4;
            lVar72 = lVar72 + 4;
          }
          lVar73 = lVar73 + local_128;
          lVar76 = lVar76 + local_128;
          local_310 = local_310 + local_128;
          local_328 = local_328 + local_128;
          local_320 = local_320 + local_128;
          local_2f0 = local_2f0 + local_128;
          local_308 = local_308 + local_128;
          local_2d0 = local_2d0 + local_128;
        }
        for (; (long)uVar55 < lVar34; uVar55 = uVar55 + 1) {
          pvVar24 = pvVar15;
          for (lVar72 = 0; local_148 != lVar72; lVar72 = lVar72 + 4) {
            *(undefined4 *)((long)pvVar15 + lVar72 * 8) = *(undefined4 *)(lVar73 + lVar72);
            *(undefined4 *)((long)pvVar15 + lVar72 * 8 + 4) = *(undefined4 *)(lVar76 + lVar72);
            *(undefined4 *)((long)pvVar15 + lVar72 * 8 + 8) = *(undefined4 *)(local_310 + lVar72);
            *(undefined4 *)((long)pvVar15 + lVar72 * 8 + 0xc) = *(undefined4 *)(local_328 + lVar72);
            *(undefined4 *)((long)pvVar15 + lVar72 * 8 + 0x10) = *(undefined4 *)(local_320 + lVar72)
            ;
            *(undefined4 *)((long)pvVar15 + lVar72 * 8 + 0x14) = *(undefined4 *)(local_2f0 + lVar72)
            ;
            *(undefined4 *)((long)pvVar15 + lVar72 * 8 + 0x18) = *(undefined4 *)(local_308 + lVar72)
            ;
            *(undefined4 *)((long)pvVar15 + lVar72 * 8 + 0x1c) = *(undefined4 *)(local_2d0 + lVar72)
            ;
            pvVar24 = (void *)((long)pvVar24 + 0x20);
          }
          local_2d0 = local_2d0 + lVar45;
          local_308 = local_308 + lVar45;
          local_2f0 = local_2f0 + lVar45;
          local_320 = local_320 + lVar45;
          local_328 = local_328 + lVar45;
          local_310 = local_310 + lVar45;
          lVar76 = lVar76 + lVar45;
          lVar73 = lVar73 + lVar45;
          pvVar15 = pvVar24;
        }
        iVar70 = iVar70 + iVar22;
        iVar51 = iVar51 + iVar22;
        iVar54 = iVar54 + iVar22;
        iVar59 = iVar59 + iVar22;
        iVar74 = iVar74 + iVar22;
        iVar18 = iVar18 + iVar22;
        iVar19 = iVar19 + iVar22;
        iVar20 = iVar20 + iVar22;
      }
      lVar56 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
      pvVar2 = (this->weight_data_tm).data;
      sVar3 = (this->weight_data_tm).elemsize;
      sVar4 = (this->weight_data_tm).cstep;
      iVar18 = iVar21 * 4;
      for (; (long)(uVar38 | 3) < (long)uVar13; uVar38 = uVar38 + 4) {
        lVar72 = lVar56 + (long)iVar70 * 4;
        lVar32 = lVar56 + (long)iVar51 * 4;
        lVar37 = lVar56 + (long)iVar54 * 4;
        lVar50 = lVar56 + (long)iVar59 * 4;
        puVar14 = (undefined4 *)
                  ((ulong)(((uint)(uVar38 >> 3) & 1) + ((uint)(uVar38 >> 4) & 0xfffffff) +
                          (uint)(((uint)uVar38 >> 2 & 1) != 0)) * sVar3 * sVar4 + (long)pvVar2);
        lVar73 = 0;
        lVar52 = lVar32;
        lVar57 = lVar50;
        lVar67 = lVar37;
        lVar68 = lVar72;
        for (uVar55 = 0; (long)(uVar55 | 0xf) < lVar34; uVar55 = uVar55 + 0x10) {
          lVar76 = lVar73;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar30 = lVar76;
            for (lVar42 = 0; (int)lVar42 != 0x100; lVar42 = lVar42 + 0x10) {
              *(undefined4 *)((long)puVar14 + lVar42) = *(undefined4 *)(lVar72 + lVar30);
              *(undefined4 *)((long)puVar14 + lVar42 + 4) = *(undefined4 *)(lVar32 + lVar30);
              *(undefined4 *)((long)puVar14 + lVar42 + 8) = *(undefined4 *)(lVar37 + lVar30);
              *(undefined4 *)((long)puVar14 + lVar42 + 0xc) = *(undefined4 *)(lVar50 + lVar30);
              lVar30 = lVar30 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar42);
            lVar76 = lVar76 + 4;
          }
          lVar73 = lVar73 + local_110;
          lVar68 = lVar68 + local_110;
          lVar52 = lVar52 + local_110;
          lVar67 = lVar67 + local_110;
          lVar57 = lVar57 + local_110;
        }
        for (; (long)(uVar55 | 7) < lVar34; uVar55 = uVar55 + 8) {
          lVar72 = lVar57;
          lVar32 = lVar67;
          lVar37 = lVar52;
          lVar50 = lVar68;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar76 = 0;
            for (lVar73 = 0; (int)lVar73 != 0x80; lVar73 = lVar73 + 0x10) {
              *(undefined4 *)((long)puVar14 + lVar73) = *(undefined4 *)(lVar50 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 4) = *(undefined4 *)(lVar37 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 8) = *(undefined4 *)(lVar32 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 0xc) = *(undefined4 *)(lVar72 + lVar76);
              lVar76 = lVar76 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar73);
            lVar50 = lVar50 + 4;
            lVar37 = lVar37 + 4;
            lVar32 = lVar32 + 4;
            lVar72 = lVar72 + 4;
          }
          lVar68 = lVar68 + local_118;
          lVar52 = lVar52 + local_118;
          lVar67 = lVar67 + local_118;
          lVar57 = lVar57 + local_118;
        }
        for (; (long)(uVar55 | 3) < lVar34; uVar55 = uVar55 + 4) {
          lVar72 = lVar57;
          lVar32 = lVar67;
          lVar37 = lVar52;
          lVar50 = lVar68;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar76 = 0;
            for (lVar73 = 0; (int)lVar73 != 0x40; lVar73 = lVar73 + 0x10) {
              *(undefined4 *)((long)puVar14 + lVar73) = *(undefined4 *)(lVar50 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 4) = *(undefined4 *)(lVar37 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 8) = *(undefined4 *)(lVar32 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 0xc) = *(undefined4 *)(lVar72 + lVar76);
              lVar76 = lVar76 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar73);
            lVar50 = lVar50 + 4;
            lVar37 = lVar37 + 4;
            lVar32 = lVar32 + 4;
            lVar72 = lVar72 + 4;
          }
          lVar68 = lVar68 + local_120;
          lVar52 = lVar52 + local_120;
          lVar67 = lVar67 + local_120;
          lVar57 = lVar57 + local_120;
        }
        for (; (long)(uVar55 | 1) < lVar34; uVar55 = uVar55 + 2) {
          lVar72 = lVar57;
          lVar32 = lVar67;
          lVar37 = lVar52;
          lVar50 = lVar68;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar76 = 0;
            for (lVar73 = 0; (int)lVar73 != 0x20; lVar73 = lVar73 + 0x10) {
              *(undefined4 *)((long)puVar14 + lVar73) = *(undefined4 *)(lVar50 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 4) = *(undefined4 *)(lVar37 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 8) = *(undefined4 *)(lVar32 + lVar76);
              *(undefined4 *)((long)puVar14 + lVar73 + 0xc) = *(undefined4 *)(lVar72 + lVar76);
              lVar76 = lVar76 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar73);
            lVar50 = lVar50 + 4;
            lVar37 = lVar37 + 4;
            lVar32 = lVar32 + 4;
            lVar72 = lVar72 + 4;
          }
          lVar68 = lVar68 + local_128;
          lVar52 = lVar52 + local_128;
          lVar67 = lVar67 + local_128;
          lVar57 = lVar57 + local_128;
        }
        for (; (long)uVar55 < lVar34; uVar55 = uVar55 + 1) {
          for (uVar75 = 0; uVar71 != uVar75; uVar75 = uVar75 + 1) {
            *puVar14 = *(undefined4 *)(lVar68 + uVar75 * 4);
            puVar14[1] = *(undefined4 *)(lVar52 + uVar75 * 4);
            puVar14[2] = *(undefined4 *)(lVar67 + uVar75 * 4);
            puVar14[3] = *(undefined4 *)(lVar57 + uVar75 * 4);
            puVar14 = puVar14 + 4;
          }
          lVar57 = lVar57 + lVar45;
          lVar67 = lVar67 + lVar45;
          lVar52 = lVar52 + lVar45;
          lVar68 = lVar68 + lVar45;
        }
        iVar70 = iVar70 + iVar18;
        iVar51 = iVar51 + iVar18;
        iVar54 = iVar54 + iVar18;
        iVar59 = iVar59 + iVar18;
      }
      local_138 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
      local_140 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
      lVar56 = local_140 + (long)(int)(uVar36 * 0xf) * 4;
      lVar72 = local_140 + (long)(int)(uVar36 * 0xe) * 4;
      local_130 = local_140 + (long)(int)(uVar36 * 0xd) * 4;
      lVar32 = local_140 + (long)(int)(uVar36 * 0xc) * 4;
      lVar37 = local_140 + (long)(int)(uVar36 * 0xb) * 4;
      lVar50 = local_140 + (long)(int)(uVar36 * 10) * 4;
      lVar52 = local_140 + (long)(int)(uVar36 * 9) * 4;
      lVar57 = local_140 + (long)(int)(uVar36 * 8) * 4;
      lVar67 = local_140 + (long)(int)(uVar36 * 7) * 4;
      lVar68 = local_140 + (long)(int)(uVar36 * 6) * 4;
      lVar73 = local_140 + (long)(int)(uVar36 * 5) * 4;
      lVar76 = local_140 + (long)(int)(uVar36 * 4) * 4;
      lVar30 = local_140 + (long)(int)(uVar36 * 3) * 4;
      lVar42 = local_140 + (long)(int)(uVar36 * 2) * 4;
      pvVar2 = (this->weight_data_tm).data;
      lVar66 = local_140 + local_68 * 4;
      for (; (long)(uVar38 | 1) < (long)uVar13; uVar38 = uVar38 + 2) {
        lVar25 = (long)iVar51;
        local_2f0 = lVar56 + lVar25 * 4;
        local_2d0 = lVar72 + lVar25 * 4;
        local_240 = local_130 + lVar25 * 4;
        local_2c0 = lVar32 + lVar25 * 4;
        local_298 = lVar37 + lVar25 * 4;
        local_2a0 = lVar50 + lVar25 * 4;
        local_2a8 = lVar52 + lVar25 * 4;
        local_2b0 = lVar57 + lVar25 * 4;
        local_2b8 = lVar67 + lVar25 * 4;
        local_320 = lVar68 + lVar25 * 4;
        local_328 = lVar73 + lVar25 * 4;
        local_310 = lVar76 + lVar25 * 4;
        lVar65 = lVar30 + lVar25 * 4;
        lVar49 = lVar42 + lVar25 * 4;
        lVar43 = lVar66 + lVar25 * 4;
        lVar25 = local_140 + lVar25 * 4;
        lVar26 = (long)iVar70;
        local_248 = lVar56 + lVar26 * 4;
        local_250 = lVar72 + lVar26 * 4;
        local_258 = local_130 + lVar26 * 4;
        local_260 = lVar32 + lVar26 * 4;
        local_268 = lVar37 + lVar26 * 4;
        local_270 = lVar50 + lVar26 * 4;
        local_278 = lVar52 + lVar26 * 4;
        local_280 = lVar57 + lVar26 * 4;
        local_308 = lVar67 + lVar26 * 4;
        lVar31 = lVar68 + lVar26 * 4;
        lVar69 = lVar73 + lVar26 * 4;
        lVar58 = lVar76 + lVar26 * 4;
        lVar46 = lVar30 + lVar26 * 4;
        lVar53 = lVar42 + lVar26 * 4;
        lVar61 = lVar66 + lVar26 * 4;
        lVar26 = local_140 + lVar26 * 4;
        puVar14 = (undefined4 *)
                  ((ulong)(((uint)(uVar38 >> 2) & 1) +
                           ((uint)(uVar38 >> 4) & 0xfffffff) + (uint)(((uint)uVar38 >> 3 & 1) != 0)
                          + (uint)(((uint)uVar38 >> 1 & 1) != 0)) * local_138 + (long)pvVar2);
        for (uVar55 = 0; (long)(uVar55 | 0xf) < lVar34; uVar55 = uVar55 + 0x10) {
          for (lVar27 = 0; local_148 != lVar27; lVar27 = lVar27 + 4) {
            *puVar14 = *(undefined4 *)(lVar26 + lVar27);
            puVar14[1] = *(undefined4 *)(lVar61 + lVar27);
            puVar14[2] = *(undefined4 *)(lVar53 + lVar27);
            puVar14[3] = *(undefined4 *)(lVar46 + lVar27);
            puVar14[4] = *(undefined4 *)(lVar58 + lVar27);
            puVar14[5] = *(undefined4 *)(lVar69 + lVar27);
            puVar14[6] = *(undefined4 *)(lVar31 + lVar27);
            puVar14[7] = *(undefined4 *)(local_308 + lVar27);
            puVar14[8] = *(undefined4 *)(local_280 + lVar27);
            puVar14[9] = *(undefined4 *)(local_278 + lVar27);
            puVar14[10] = *(undefined4 *)(local_270 + lVar27);
            puVar14[0xb] = *(undefined4 *)(local_268 + lVar27);
            puVar14[0xc] = *(undefined4 *)(local_260 + lVar27);
            puVar14[0xd] = *(undefined4 *)(local_258 + lVar27);
            puVar14[0xe] = *(undefined4 *)(local_250 + lVar27);
            puVar14[0xf] = *(undefined4 *)(local_248 + lVar27);
            puVar14[0x10] = *(undefined4 *)(lVar25 + lVar27);
            puVar14[0x11] = *(undefined4 *)(lVar43 + lVar27);
            puVar14[0x12] = *(undefined4 *)(lVar49 + lVar27);
            puVar14[0x13] = *(undefined4 *)(lVar65 + lVar27);
            puVar14[0x14] = *(undefined4 *)(local_310 + lVar27);
            puVar14[0x15] = *(undefined4 *)(local_328 + lVar27);
            puVar14[0x16] = *(undefined4 *)(local_320 + lVar27);
            puVar14[0x17] = *(undefined4 *)(local_2b8 + lVar27);
            puVar14[0x18] = *(undefined4 *)(local_2b0 + lVar27);
            puVar14[0x19] = *(undefined4 *)(local_2a8 + lVar27);
            puVar14[0x1a] = *(undefined4 *)(local_2a0 + lVar27);
            puVar14[0x1b] = *(undefined4 *)(local_298 + lVar27);
            puVar14[0x1c] = *(undefined4 *)(local_2c0 + lVar27);
            puVar14[0x1d] = *(undefined4 *)(local_240 + lVar27);
            puVar14[0x1e] = *(undefined4 *)(local_2d0 + lVar27);
            puVar14[0x1f] = *(undefined4 *)(local_2f0 + lVar27);
            puVar14 = puVar14 + 0x20;
          }
          local_2f0 = local_2f0 + local_110;
          local_2d0 = local_2d0 + local_110;
          local_240 = local_240 + local_110;
          local_2c0 = local_2c0 + local_110;
          local_298 = local_298 + local_110;
          local_2a0 = local_2a0 + local_110;
          local_2a8 = local_2a8 + local_110;
          local_2b0 = local_2b0 + local_110;
          local_2b8 = local_2b8 + local_110;
          local_320 = local_320 + local_110;
          local_328 = local_328 + local_110;
          local_310 = local_310 + local_110;
          lVar65 = lVar65 + local_110;
          lVar49 = lVar49 + local_110;
          lVar43 = lVar43 + local_110;
          lVar25 = lVar25 + local_110;
          local_248 = local_248 + local_110;
          local_250 = local_250 + local_110;
          local_258 = local_258 + local_110;
          local_260 = local_260 + local_110;
          local_268 = local_268 + local_110;
          local_270 = local_270 + local_110;
          local_278 = local_278 + local_110;
          local_280 = local_280 + local_110;
          local_308 = local_308 + local_110;
          lVar31 = lVar31 + local_110;
          lVar69 = lVar69 + local_110;
          lVar58 = lVar58 + local_110;
          lVar46 = lVar46 + local_110;
          lVar53 = lVar53 + local_110;
          lVar61 = lVar61 + local_110;
          lVar26 = lVar26 + local_110;
        }
        for (; (long)(uVar55 | 7) < lVar34; uVar55 = uVar55 + 8) {
          for (lVar27 = 0; local_148 != lVar27; lVar27 = lVar27 + 4) {
            *puVar14 = *(undefined4 *)(lVar26 + lVar27);
            puVar14[1] = *(undefined4 *)(lVar61 + lVar27);
            puVar14[2] = *(undefined4 *)(lVar53 + lVar27);
            puVar14[3] = *(undefined4 *)(lVar46 + lVar27);
            puVar14[4] = *(undefined4 *)(lVar58 + lVar27);
            puVar14[5] = *(undefined4 *)(lVar69 + lVar27);
            puVar14[6] = *(undefined4 *)(lVar31 + lVar27);
            puVar14[7] = *(undefined4 *)(local_308 + lVar27);
            puVar14[8] = *(undefined4 *)(lVar25 + lVar27);
            puVar14[9] = *(undefined4 *)(lVar43 + lVar27);
            puVar14[10] = *(undefined4 *)(lVar49 + lVar27);
            puVar14[0xb] = *(undefined4 *)(lVar65 + lVar27);
            puVar14[0xc] = *(undefined4 *)(local_310 + lVar27);
            puVar14[0xd] = *(undefined4 *)(local_328 + lVar27);
            puVar14[0xe] = *(undefined4 *)(local_320 + lVar27);
            puVar14[0xf] = *(undefined4 *)(local_2b8 + lVar27);
            puVar14 = puVar14 + 0x10;
          }
          local_2b8 = local_2b8 + local_118;
          local_320 = local_320 + local_118;
          local_328 = local_328 + local_118;
          local_310 = local_310 + local_118;
          lVar65 = lVar65 + local_118;
          lVar49 = lVar49 + local_118;
          lVar43 = lVar43 + local_118;
          lVar25 = lVar25 + local_118;
          local_308 = local_308 + local_118;
          lVar31 = lVar31 + local_118;
          lVar69 = lVar69 + local_118;
          lVar58 = lVar58 + local_118;
          lVar46 = lVar46 + local_118;
          lVar53 = lVar53 + local_118;
          lVar61 = lVar61 + local_118;
          lVar26 = lVar26 + local_118;
        }
        for (; (long)(uVar55 | 3) < lVar34; uVar55 = uVar55 + 4) {
          puVar63 = puVar14;
          for (lVar31 = 0; local_148 != lVar31; lVar31 = lVar31 + 4) {
            puVar14[lVar31 * 2] = *(undefined4 *)(lVar26 + lVar31);
            puVar14[lVar31 * 2 + 1] = *(undefined4 *)(lVar61 + lVar31);
            puVar14[lVar31 * 2 + 2] = *(undefined4 *)(lVar53 + lVar31);
            puVar14[lVar31 * 2 + 3] = *(undefined4 *)(lVar46 + lVar31);
            puVar14[lVar31 * 2 + 4] = *(undefined4 *)(lVar25 + lVar31);
            puVar14[lVar31 * 2 + 5] = *(undefined4 *)(lVar43 + lVar31);
            puVar14[lVar31 * 2 + 6] = *(undefined4 *)(lVar49 + lVar31);
            puVar14[lVar31 * 2 + 7] = *(undefined4 *)(lVar65 + lVar31);
            puVar63 = puVar63 + 8;
          }
          lVar65 = lVar65 + local_120;
          lVar49 = lVar49 + local_120;
          lVar43 = lVar43 + local_120;
          lVar25 = lVar25 + local_120;
          lVar46 = lVar46 + local_120;
          lVar53 = lVar53 + local_120;
          lVar61 = lVar61 + local_120;
          lVar26 = lVar26 + local_120;
          puVar14 = puVar63;
        }
        for (; (long)(uVar55 | 1) < lVar34; uVar55 = uVar55 + 2) {
          lVar65 = lVar25;
          lVar49 = lVar26;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            lVar31 = 0;
            for (lVar43 = 0; (int)lVar43 != 0x10; lVar43 = lVar43 + 8) {
              *(undefined4 *)((long)puVar14 + lVar43) = *(undefined4 *)(lVar49 + lVar31);
              *(undefined4 *)((long)puVar14 + lVar43 + 4) = *(undefined4 *)(lVar65 + lVar31);
              lVar31 = lVar31 + lVar45;
            }
            puVar14 = (undefined4 *)((long)puVar14 + lVar43);
            lVar49 = lVar49 + 4;
            lVar65 = lVar65 + 4;
          }
          lVar26 = lVar26 + local_128;
          lVar25 = lVar25 + local_128;
        }
        for (; (long)uVar55 < lVar34; uVar55 = uVar55 + 1) {
          for (uVar75 = 0; uVar71 != uVar75; uVar75 = uVar75 + 1) {
            *puVar14 = *(undefined4 *)(lVar26 + uVar75 * 4);
            puVar14[1] = *(undefined4 *)(lVar25 + uVar75 * 4);
            puVar14 = puVar14 + 2;
          }
          lVar25 = lVar25 + lVar45;
          lVar26 = lVar26 + lVar45;
        }
        iVar70 = iVar70 + iVar21 * 2;
        iVar51 = iVar51 + iVar21 * 2;
      }
      lVar45 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
      pvVar2 = (this->weight_data_tm).data;
      sVar3 = (this->weight_data_tm).elemsize;
      sVar4 = (this->weight_data_tm).cstep;
      for (; (long)uVar38 < (long)uVar13; uVar38 = uVar38 + 1) {
        uVar17 = (uint)uVar38;
        lVar56 = lVar45 + local_68 * 4 + (long)iVar70 * 4;
        puVar14 = (undefined4 *)(lVar45 + (long)iVar70 * 4);
        puVar63 = (undefined4 *)
                  ((ulong)((uVar17 & 1) + ((uint)(uVar38 >> 4) & 0xfffffff) +
                           (uint)((uVar17 >> 3 & 1) != 0) + ((uint)(uVar38 >> 2) & 1) +
                          (uint)((uVar17 >> 1 & 1) != 0)) * sVar3 * sVar4 + (long)pvVar2);
        for (uVar55 = 0; (long)(uVar55 | 0xf) < lVar34; uVar55 = uVar55 + 0x10) {
          puVar28 = puVar14;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            puVar77 = puVar28;
            for (lVar72 = 0; (int)lVar72 != 0x40; lVar72 = lVar72 + 4) {
              *(undefined4 *)((long)puVar63 + lVar72) = *puVar77;
              puVar77 = puVar77 + local_68;
            }
            puVar63 = (undefined4 *)((long)puVar63 + lVar72);
            puVar28 = puVar28 + 1;
          }
          puVar14 = puVar14 + local_68 * 0x10;
          lVar56 = lVar56 + local_110;
        }
        for (; (long)(uVar55 | 7) < lVar34; uVar55 = uVar55 + 8) {
          puVar28 = puVar14;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            puVar77 = puVar28;
            for (lVar72 = 0; (int)lVar72 != 0x20; lVar72 = lVar72 + 4) {
              *(undefined4 *)((long)puVar63 + lVar72) = *puVar77;
              puVar77 = puVar77 + local_68;
            }
            puVar63 = (undefined4 *)((long)puVar63 + lVar72);
            puVar28 = puVar28 + 1;
          }
          puVar14 = puVar14 + local_68 * 8;
          lVar56 = lVar56 + local_118;
        }
        for (; (long)(uVar55 | 3) < lVar34; uVar55 = uVar55 + 4) {
          puVar28 = puVar14;
          for (uVar75 = 0; uVar75 != uVar71; uVar75 = uVar75 + 1) {
            puVar77 = puVar28;
            for (lVar72 = 0; (int)lVar72 != 0x10; lVar72 = lVar72 + 4) {
              *(undefined4 *)((long)puVar63 + lVar72) = *puVar77;
              puVar77 = puVar77 + local_68;
            }
            puVar63 = (undefined4 *)((long)puVar63 + lVar72);
            puVar28 = puVar28 + 1;
          }
          puVar14 = puVar14 + local_68 * 4;
          lVar56 = lVar56 + local_120;
        }
        for (; (long)(uVar55 | 1) < lVar34; uVar55 = uVar55 + 2) {
          for (uVar75 = 0; uVar71 != uVar75; uVar75 = uVar75 + 1) {
            *puVar63 = puVar14[uVar75];
            puVar63[1] = *(undefined4 *)(lVar56 + uVar75 * 4);
            puVar63 = puVar63 + 2;
          }
          lVar56 = lVar56 + local_128;
          puVar14 = puVar14 + local_68 * 2;
        }
        for (; (long)uVar55 < lVar34; uVar55 = uVar55 + 1) {
          for (lVar56 = 0; local_148 != lVar56; lVar56 = lVar56 + 4) {
            *(undefined4 *)((long)puVar63 + lVar56) = *(undefined4 *)((long)puVar14 + lVar56);
          }
          puVar14 = puVar14 + local_68;
          puVar63 = (undefined4 *)((long)puVar63 + lVar56);
        }
        iVar70 = iVar70 + iVar21;
      }
    }
LAB_001b5269:
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var33 = this->_vptr_Convolution_x86_avx512[-3];
    goto LAB_001b528e;
  }
  lVar34 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var33);
  if (((lVar34 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var33)) ||
      (*(int *)(lVar34 + 0x2c) == 0)) || (*(int *)(lVar34 + 0x30) == 0)) {
    lVar45 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var33);
    lVar56 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var33);
    if (((lVar45 != lVar56) && (*(int *)(lVar45 + 0x2c) != 0)) && (*(int *)(lVar45 + 0x30) != 0))
    goto LAB_001b5355;
    if (((0x20 < (int)uVar17) || (opt->use_winograd63_convolution == false)) || (0x20 < (int)_h)) {
      pMVar64 = (Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
      if (opt->use_winograd43_convolution == true) {
        conv3x3s1_winograd43_transform_kernel(pMVar64,&this->weight_winograd43_data,_h,uVar17,opt);
      }
      else {
        conv3x3s1_winograd23_transform_kernel(pMVar64,&this->weight_winograd23_data,_h,uVar17,opt);
      }
      goto LAB_001b82d1;
    }
LAB_001b82c0:
    conv3x3s1_winograd63_transform_kernel
              ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
               &this->weight_winograd63_data,_h,uVar17,opt);
  }
  else {
    lVar45 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var33);
    lVar56 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var33);
LAB_001b5355:
    if (((lVar45 == lVar56) || (iVar70 = *(int *)(lVar45 + 0x2c), iVar70 == 0)) ||
       (iVar18 = *(int *)(lVar45 + 0x30), iVar18 == 0)) {
      iVar70 = *(int *)(lVar34 + 0x2c);
      iVar18 = *(int *)(lVar34 + 0x30);
      iVar19 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var33 + 4));
      iVar20 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var33);
      if (((iVar20 < 1 && iVar19 < 1) &&
          (iVar21 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var33 + 4)),
          iVar21 < 1)) &&
         (iVar22 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var33),
         iVar22 < 1)) {
        if ((iVar22 == -0xe9 && (iVar21 == -0xe9 && (iVar20 == -0xe9 && iVar19 == -0xe9))) ||
           (iVar22 == -0xea && (iVar21 == -0xea && (iVar20 == -0xea && iVar19 == -0xea))))
        goto LAB_001b5376;
      }
      else {
        iVar70 = iVar19 + iVar70 + iVar20;
        iVar18 = iVar18 + *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var33 + 4))
                 + *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var33);
      }
    }
    else {
LAB_001b5376:
      iVar70 = iVar70 + 2;
      iVar18 = iVar18 + 2;
    }
    bVar7 = test_prefer_winograd63(_h,uVar17,iVar70,iVar18);
    bVar8 = test_prefer_winograd23(_h,uVar17,iVar70,iVar18);
    bVar16 = bVar8 & bVar29;
    if (!bVar8) {
      bVar29 = bVar7;
    }
    if (bVar7) {
      bVar9 = opt->use_winograd63_convolution;
      if ((bVar29 & bVar9) != 0) goto LAB_001b590e;
LAB_001b5a14:
      if (opt->use_winograd43_convolution == false) {
        if (bVar16 != 0 || opt->use_winograd63_convolution != true) goto LAB_001b5a5c;
        if (bVar9 != 0 || opt->use_winograd63_convolution != false) goto LAB_001b82c0;
        goto LAB_001b82d1;
      }
      if (bVar16 == 0) {
        conv3x3s1_winograd43_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
                   &this->weight_winograd43_data,_h,uVar17,opt);
        goto LAB_001b82d1;
      }
    }
    else {
      if (bVar29 == 0) {
        bVar9 = 0;
        goto LAB_001b5a14;
      }
LAB_001b590e:
      if (bVar16 == 0) {
        if (bVar7) goto LAB_001b82c0;
        goto LAB_001b82d1;
      }
    }
LAB_001b5a5c:
    conv3x3s1_winograd23_transform_kernel
              ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
               &this->weight_winograd23_data,_h,uVar17,opt);
  }
LAB_001b82d1:
  if (opt->lightmode != true) {
    return 0;
  }
  p_Var33 = this->_vptr_Convolution_x86_avx512[-3];
LAB_001b528e:
  piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      plVar5 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var33);
      if (plVar5 == (long *)0x0) {
        free(*(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var33));
      }
      else {
        (**(code **)(*plVar5 + 0x18))();
      }
    }
  }
  *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var33) = 0;
  *(undefined8 *)((long)&(this->weight_winograd63_data).d + (long)p_Var33) = 0;
  *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var33) = 0;
  *(undefined8 *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33) = 0;
  *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33) = 0;
  *(undefined8 *)((long)&this->gemm + (long)p_Var33) = 0;
  *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var33) = 0;
  *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var33) = 0;
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}